

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_voxel_meshify.h
# Opt level: O0

uint32_t murmur_hash2_size4(uint32_t h,uint32_t *data,uint32_t data_len)

{
  uint32_t k;
  uint32_t m;
  uint32_t data_len_local;
  uint32_t *data_local;
  uint32_t h_local;
  
  k = data_len;
  _m = data;
  data_local._4_4_ = h;
  if ((data_len & 3) != 0) {
    __assert_fail("data_len % 4 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                  ,0x162,"uint32_t murmur_hash2_size4(uint32_t, const uint32_t *, uint32_t)");
  }
  for (; 3 < k; k = k - 4) {
    data_local._4_4_ =
         (*_m * 0x5bd1e995 >> 0x18 ^ *_m * 0x5bd1e995) * 0x5bd1e995 ^ data_local._4_4_ * 0x5bd1e995;
    _m = _m + 1;
  }
  return data_local._4_4_;
}

Assistant:

static uint32_t murmur_hash2_size4(uint32_t h, const uint32_t* data, uint32_t data_len) {
    assert(data_len % 4 == 0);	
    const uint32_t m = 0x5bd1e995;
    while (data_len >= 4) {
        uint32_t k = data[0];
        k *= m;
        k ^= k >> (signed)24;
        k *= m;
        h *= m;
        h ^= k;
        data++;
        data_len -= 4;
    }

    return h;
}